

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunlinsol_spgmr.c
# Opt level: O1

int SUNLinSolSolve_SPGMR(SUNLinearSolver S,SUNMatrix A,N_Vector x,N_Vector b,sunrealtype delta)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint *puVar5;
  undefined8 *puVar6;
  long lVar7;
  long lVar8;
  undefined8 uVar9;
  double *pdVar10;
  undefined8 uVar11;
  long lVar12;
  long lVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  code *pcVar16;
  code *pcVar17;
  undefined8 *puVar18;
  undefined8 *puVar19;
  bool bVar20;
  int iVar21;
  uint uVar22;
  int iVar23;
  ulong uVar24;
  ulong uVar25;
  double *pdVar26;
  long lVar27;
  long lVar28;
  uint uVar29;
  ulong uVar30;
  bool bVar31;
  double dVar32;
  double dVar33;
  undefined4 uVar34;
  double local_a8;
  undefined8 uStack_a0;
  double local_80;
  undefined1 local_48 [16];
  
  puVar5 = (uint *)S->content;
  uVar1 = *puVar5;
  uVar24 = (ulong)uVar1;
  uVar2 = puVar5[2];
  uVar3 = puVar5[3];
  puVar6 = *(undefined8 **)(puVar5 + 0x18);
  lVar7 = *(long *)(puVar5 + 0x1a);
  lVar8 = *(long *)(puVar5 + 0x1c);
  uVar9 = *(undefined8 *)(puVar5 + 0x1e);
  pdVar10 = *(double **)(puVar5 + 0x20);
  uVar11 = *(undefined8 *)(puVar5 + 0x22);
  lVar12 = *(long *)(puVar5 + 0x14);
  lVar13 = *(long *)(puVar5 + 0x16);
  uVar14 = *(undefined8 *)(puVar5 + 0xc);
  uVar15 = *(undefined8 *)(puVar5 + 0x12);
  pcVar16 = *(code **)(puVar5 + 10);
  pcVar17 = *(code **)(puVar5 + 0x10);
  puVar18 = *(undefined8 **)(puVar5 + 0x24);
  puVar19 = *(undefined8 **)(puVar5 + 0x26);
  puVar5[5] = 0;
  uVar4 = puVar5[1];
  if (puVar5[4] == 0) {
    iVar21 = (*pcVar16)(uVar14,x,uVar11);
    if (iVar21 == 0) {
      N_VLinearSum(0x3ff0000000000000,b,uVar11,uVar11);
      goto LAB_00101636;
    }
LAB_001016b3:
    bVar31 = iVar21 < 0;
    puVar5[4] = 0;
    iVar23 = -0x325;
    iVar21 = 0x323;
LAB_001016c4:
    if (bVar31) {
      iVar21 = iVar23;
    }
    goto LAB_00101cab;
  }
  N_VScale(0x3ff0000000000000,b,uVar11);
LAB_00101636:
  N_VScale(0x3ff0000000000000,uVar11,*puVar6);
  if ((uVar4 | 2) == 3) {
    iVar21 = (*pcVar17)(delta,uVar15,*puVar6,uVar11,1);
    bVar31 = iVar21 < 0;
    if (iVar21 != 0) {
LAB_00101685:
      puVar5[4] = 0;
      iVar23 = -0x328;
      iVar21 = 0x325;
      goto LAB_001016c4;
    }
  }
  else {
    N_VScale(0x3ff0000000000000,*puVar6,uVar11);
  }
  if (lVar12 == 0) {
    N_VScale(0x3ff0000000000000,uVar11,*puVar6);
  }
  else {
    N_VProd(lVar12,uVar11);
  }
  dVar32 = (double)N_VDotProd();
  dVar33 = 0.0;
  if (0.0 < dVar32) {
    if (dVar32 < 0.0) {
      dVar33 = sqrt(dVar32);
    }
    else {
      dVar33 = SQRT(dVar32);
    }
  }
  *(double *)(puVar5 + 6) = dVar33;
  if (dVar33 <= delta) {
    puVar5[4] = 0;
    iVar21 = 0;
    goto LAB_00101cab;
  }
  N_VConst(0,uVar9);
  dVar32 = dVar33;
  if (-1 < (int)uVar3) {
    uVar22 = 0;
    uVar34 = 0;
    uStack_a0._4_4_ = 0;
    local_48._8_8_ = 0;
    local_48._0_8_ = dVar33;
    uVar29 = 0;
    local_a8 = dVar33;
    do {
      uStack_a0._0_4_ = uVar34;
      if (-1 < (int)uVar1) {
        uVar30 = 0;
        do {
          if (0 < (int)uVar1) {
            memset(*(void **)(lVar7 + uVar30 * 8),0,uVar24 * 8);
          }
          uVar30 = uVar30 + 1;
        } while (uVar1 + 1 != uVar30);
      }
      N_VScale(1.0 / local_a8);
      bVar20 = 0 < (int)uVar1;
      if (0 < (int)uVar1) {
        lVar28 = 4;
        local_80 = 1.0;
        uVar30 = 0;
        do {
          puVar5[5] = puVar5[5] + 1;
          if (lVar13 == 0) {
            N_VScale(0x3ff0000000000000,puVar6[uVar30],uVar11);
          }
          else {
            N_VDiv(puVar6[uVar30],lVar13,uVar11);
          }
          if ((uVar4 & 0xfffffffe) == 2) {
            N_VScale(0x3ff0000000000000,uVar11,puVar6[uVar30 + 1]);
            iVar21 = (*pcVar17)(delta,uVar15,puVar6[uVar30 + 1],uVar11,2);
            bVar31 = iVar21 < 0;
            if (iVar21 != 0) goto LAB_00101685;
          }
          iVar21 = (*pcVar16)(uVar14,uVar11,puVar6[uVar30 + 1]);
          if (iVar21 != 0) goto LAB_001016b3;
          if ((uVar4 | 2) == 3) {
            iVar21 = (*pcVar17)(delta,uVar15,puVar6[uVar30 + 1],uVar11,1);
            bVar31 = iVar21 < 0;
            if (iVar21 != 0) goto LAB_00101685;
          }
          else {
            N_VScale(0x3ff0000000000000,puVar6[uVar30 + 1],uVar11);
          }
          if (lVar12 == 0) {
            N_VScale(0x3ff0000000000000,uVar11,puVar6[uVar30 + 1]);
          }
          else {
            N_VProd(lVar12,uVar11);
          }
          uVar25 = uVar30 + 1;
          lVar27 = *(long *)(lVar7 + 8 + uVar30 * 8) + lVar28 + -4;
          if (uVar2 == 2) {
            SUNClassicalGS(puVar6,lVar7,uVar25 & 0xffffffff,uVar24,lVar27,puVar18,puVar19);
          }
          else {
            SUNModifiedGS(puVar6,lVar7,uVar25 & 0xffffffff,uVar24,lVar27);
          }
          iVar21 = SUNQRfact(uVar25 & 0xffffffff,lVar7,lVar8,uVar30 & 0xffffffff);
          if (iVar21 != 0) {
            puVar5[4] = 0;
            iVar21 = 0x327;
            goto LAB_00101cab;
          }
          local_80 = local_80 * *(double *)(lVar8 + lVar28 * 2);
          dVar32 = ABS(local_a8 * local_80);
          *(double *)(puVar5 + 6) = dVar32;
          local_48._8_4_ = (int)(uStack_a0 & 0x7fffffffffffffff);
          local_48._0_8_ = dVar32;
          local_48._12_4_ = (int)((uStack_a0 & 0x7fffffffffffffff) >> 0x20);
          if (dVar32 <= delta) {
            uVar29 = (int)uVar30 + 1;
            break;
          }
          N_VScale(1.0 / *(double *)(*(long *)(lVar7 + 8 + uVar30 * 8) + uVar30 * 8));
          bVar20 = (long)uVar25 < (long)(int)uVar1;
          lVar28 = lVar28 + 8;
          uVar30 = uVar25;
          uVar29 = uVar1;
        } while (uVar24 != uVar25);
      }
      *pdVar10 = local_a8;
      uVar30 = (ulong)uVar29;
      if (0 < (int)uVar29) {
        memset(pdVar10 + 1,0,uVar30 * 8);
      }
      iVar21 = SUNQRsol(uVar29,lVar7,lVar8,pdVar10);
      if (iVar21 != 0) {
        puVar5[4] = 0;
        iVar21 = -0x32b;
        goto LAB_00101cab;
      }
      *puVar18 = 0x3ff0000000000000;
      *puVar19 = uVar9;
      if (0 < (int)uVar29) {
        uVar25 = 0;
        do {
          puVar18[uVar25 + 1] = pdVar10[uVar25];
          puVar19[uVar25 + 1] = puVar6[uVar25];
          uVar25 = uVar25 + 1;
        } while (uVar30 != uVar25);
      }
      uVar25 = (ulong)(uVar29 + 1);
      N_VLinearCombination(uVar25,puVar18,puVar19,uVar9);
      if (bVar20) {
        if (lVar13 != 0) {
          N_VDiv(uVar9,lVar13,uVar9);
        }
        if ((uVar4 & 0xfffffffe) == 2) {
          iVar23 = (*pcVar17)(delta,uVar15,uVar9,uVar11,2);
          if (iVar23 != 0) goto LAB_00101da6;
        }
        else {
          N_VScale(0x3ff0000000000000,uVar9,uVar11);
        }
        if (puVar5[4] == 0) {
          N_VLinearSum(0x3ff0000000000000,0,x,uVar11,x);
        }
        else {
          N_VScale(0x3ff0000000000000,uVar11,x);
        }
        puVar5[4] = 0;
        iVar21 = 0;
        goto LAB_00101cab;
      }
      if (uVar22 == uVar3) goto LAB_00101d39;
      dVar32 = 1.0;
      if (0 < (int)uVar29) {
        pdVar26 = (double *)(uVar30 * 0x10 + lVar8 + -8);
        lVar28 = uVar30 + 1;
        dVar32 = 1.0;
        do {
          pdVar10[lVar28 + -1] = pdVar26[-1] * dVar32;
          dVar32 = dVar32 * *pdVar26;
          pdVar26 = pdVar26 + -2;
          lVar28 = lVar28 + -1;
        } while (1 < lVar28);
      }
      *pdVar10 = dVar32;
      if (-1 < (int)uVar29) {
        uVar30 = 0;
        do {
          pdVar10[uVar30] = pdVar10[uVar30] * local_a8 * dVar32;
          uVar30 = uVar30 + 1;
        } while (uVar25 != uVar30);
      }
      if (-1 < (int)uVar29) {
        uVar30 = 0;
        do {
          puVar18[uVar30] = pdVar10[uVar30];
          puVar19[uVar30] = puVar6[uVar30];
          uVar30 = uVar30 + 1;
        } while (uVar25 != uVar30);
      }
      local_a8 = ABS(local_a8 * dVar32);
      uVar34 = (undefined4)(uStack_a0 & 0x7fffffffffffffff);
      uStack_a0._4_4_ = (undefined4)((uStack_a0 & 0x7fffffffffffffff) >> 0x20);
      N_VLinearCombination(uVar29 + 1,puVar18,puVar19,*puVar6);
      uVar22 = uVar22 + 1;
    } while( true );
  }
  goto LAB_00101d55;
LAB_00101d39:
  dVar32 = local_48._0_8_;
LAB_00101d55:
  if (dVar32 < dVar33) {
    if (lVar13 != 0) {
      N_VDiv(uVar9,lVar13,uVar9);
    }
    if ((uVar4 & 0xfffffffe) == 2) {
      iVar23 = (*pcVar17)(delta,uVar15,uVar9,uVar11,2);
      if (iVar23 != 0) {
LAB_00101da6:
        puVar5[4] = 0;
        iVar21 = 0x325;
        if (iVar23 < 0) {
          iVar21 = -0x328;
        }
        goto LAB_00101cab;
      }
    }
    else {
      N_VScale(0x3ff0000000000000,uVar9,uVar11);
    }
    if (puVar5[4] == 0) {
      N_VLinearSum(0x3ff0000000000000,0,x,uVar11,x);
    }
    else {
      N_VScale(0x3ff0000000000000,uVar11,x);
    }
    puVar5[4] = 0;
    iVar21 = 0x321;
  }
  else {
    puVar5[4] = 0;
    iVar21 = 0x322;
  }
LAB_00101cab:
  *(int *)((long)S->content + 0x20) = iVar21;
  return iVar21;
}

Assistant:

int SUNLinSolSolve_SPGMR(SUNLinearSolver S, SUNDIALS_MAYBE_UNUSED SUNMatrix A,
                         N_Vector x, N_Vector b, sunrealtype delta)
{
  SUNFunctionBegin(S->sunctx);

  /* local data and shortcut variables */
  N_Vector *V, xcor, vtemp, s1, s2;
  sunrealtype **Hes, *givens, *yg, *res_norm;
  sunrealtype beta, rotation_product, r_norm, s_product, rho;
  sunbooleantype preOnLeft, preOnRight, scale2, scale1, converged;
  sunbooleantype* zeroguess;
  int i, j, k, l, l_plus_1, l_max, krydim, ntries, max_restarts, gstype;
  int* nli;
  void *A_data, *P_data;
  SUNATimesFn atimes;
  SUNPSolveFn psolve;
  sunrealtype* cv;
  N_Vector* Xv;
  int status;

  /* Initialize some variables */
  l_plus_1 = 0;
  krydim   = 0;

  /* Make local shorcuts to solver variables. */
  l_max        = SPGMR_CONTENT(S)->maxl;
  max_restarts = SPGMR_CONTENT(S)->max_restarts;
  gstype       = SPGMR_CONTENT(S)->gstype;
  V            = SPGMR_CONTENT(S)->V;
  Hes          = SPGMR_CONTENT(S)->Hes;
  givens       = SPGMR_CONTENT(S)->givens;
  xcor         = SPGMR_CONTENT(S)->xcor;
  yg           = SPGMR_CONTENT(S)->yg;
  vtemp        = SPGMR_CONTENT(S)->vtemp;
  s1           = SPGMR_CONTENT(S)->s1;
  s2           = SPGMR_CONTENT(S)->s2;
  A_data       = SPGMR_CONTENT(S)->ATData;
  P_data       = SPGMR_CONTENT(S)->PData;
  atimes       = SPGMR_CONTENT(S)->ATimes;
  psolve       = SPGMR_CONTENT(S)->Psolve;
  zeroguess    = &(SPGMR_CONTENT(S)->zeroguess);
  nli          = &(SPGMR_CONTENT(S)->numiters);
  res_norm     = &(SPGMR_CONTENT(S)->resnorm);
  cv           = SPGMR_CONTENT(S)->cv;
  Xv           = SPGMR_CONTENT(S)->Xv;

  /* Initialize counters and convergence flag */
  *nli      = 0;
  converged = SUNFALSE;

  /* Set sunbooleantype flags for internal solver options */
  preOnLeft  = ((SPGMR_CONTENT(S)->pretype == SUN_PREC_LEFT) ||
               (SPGMR_CONTENT(S)->pretype == SUN_PREC_BOTH));
  preOnRight = ((SPGMR_CONTENT(S)->pretype == SUN_PREC_RIGHT) ||
                (SPGMR_CONTENT(S)->pretype == SUN_PREC_BOTH));
  scale1     = (s1 != NULL);
  scale2     = (s2 != NULL);

  /* Check if Atimes function has been set */
  SUNAssert(atimes, SUN_ERR_ARG_CORRUPT);

  /* If preconditioning, check if psolve has been set */
  SUNAssert(!(preOnLeft || preOnRight) || psolve, SUN_ERR_ARG_CORRUPT);

  /* Set vtemp and V[0] to initial (unscaled) residual r_0 = b - A*x_0 */
  if (*zeroguess)
  {
    N_VScale(ONE, b, vtemp);
    SUNCheckLastErr();
  }
  else
  {
    status = atimes(A_data, x, vtemp);
    if (status != 0)
    {
      *zeroguess  = SUNFALSE;
      LASTFLAG(S) = (status < 0) ? SUNLS_ATIMES_FAIL_UNREC
                                 : SUNLS_ATIMES_FAIL_REC;
      return (LASTFLAG(S));
    }
    N_VLinearSum(ONE, b, -ONE, vtemp, vtemp);
    SUNCheckLastErr();
  }
  N_VScale(ONE, vtemp, V[0]);
  SUNCheckLastErr();

  /* Apply left preconditioner and left scaling to V[0] = r_0 */
  if (preOnLeft)
  {
    status = psolve(P_data, V[0], vtemp, delta, SUN_PREC_LEFT);
    if (status != 0)
    {
      *zeroguess  = SUNFALSE;
      LASTFLAG(S) = (status < 0) ? SUNLS_PSOLVE_FAIL_UNREC
                                 : SUNLS_PSOLVE_FAIL_REC;
      return (LASTFLAG(S));
    }
  }
  else
  {
    N_VScale(ONE, V[0], vtemp);
    SUNCheckLastErr();
  }

  if (scale1)
  {
    N_VProd(s1, vtemp, V[0]);
    SUNCheckLastErr();
  }
  else
  {
    N_VScale(ONE, vtemp, V[0]);
    SUNCheckLastErr();
  }

  /* Set r_norm = beta to L2 norm of V[0] = s1 P1_inv r_0, and
     return if small  */
  r_norm = N_VDotProd(V[0], V[0]);
  SUNCheckLastErr();
  *res_norm = r_norm = beta = SUNRsqrt(r_norm);

#if SUNDIALS_LOGGING_LEVEL >= SUNDIALS_LOGGING_INFO
  SUNLogger_QueueMsg(S->sunctx->logger, SUN_LOGLEVEL_INFO,
                     "SUNLinSolSolve_SPGMR", "initial-residual",
                     "nli = %li, resnorm = %.16g", (long int)0, *res_norm);
#endif

  if (r_norm <= delta)
  {
    *zeroguess  = SUNFALSE;
    LASTFLAG(S) = SUN_SUCCESS;
    return (LASTFLAG(S));
  }

  /* Initialize rho to avoid compiler warning message */
  rho = beta;

  /* Set xcor = 0 */
  N_VConst(ZERO, xcor);
  SUNCheckLastErr();

  /* Begin outer iterations: up to (max_restarts + 1) attempts */
  for (ntries = 0; ntries <= max_restarts; ntries++)
  {
    /* Initialize the Hessenberg matrix Hes and Givens rotation
       product.  Normalize the initial vector V[0] */
    for (i = 0; i <= l_max; i++)
    {
      for (j = 0; j < l_max; j++) { Hes[i][j] = ZERO; }
    }

    rotation_product = ONE;
    N_VScale(ONE / r_norm, V[0], V[0]);
    SUNCheckLastErr();

    /* Inner loop: generate Krylov sequence and Arnoldi basis */
    for (l = 0; l < l_max; l++)
    {
      (*nli)++;
      krydim = l_plus_1 = l + 1;

      /* Generate A-tilde V[l], where A-tilde = s1 P1_inv A P2_inv s2_inv */

      /*   Apply right scaling: vtemp = s2_inv V[l] */
      if (scale2)
      {
        N_VDiv(V[l], s2, vtemp);
        SUNCheckLastErr();
      }
      else
      {
        N_VScale(ONE, V[l], vtemp);
        SUNCheckLastErr();
      }

      /*   Apply right preconditioner: vtemp = P2_inv s2_inv V[l] */
      if (preOnRight)
      {
        N_VScale(ONE, vtemp, V[l_plus_1]);
        SUNCheckLastErr();
        status = psolve(P_data, V[l_plus_1], vtemp, delta, SUN_PREC_RIGHT);
        if (status != 0)
        {
          *zeroguess  = SUNFALSE;
          LASTFLAG(S) = (status < 0) ? SUNLS_PSOLVE_FAIL_UNREC
                                     : SUNLS_PSOLVE_FAIL_REC;
          return (LASTFLAG(S));
        }
      }

      /* Apply A: V[l+1] = A P2_inv s2_inv V[l] */
      status = atimes(A_data, vtemp, V[l_plus_1]);
      if (status != 0)
      {
        *zeroguess  = SUNFALSE;
        LASTFLAG(S) = (status < 0) ? SUNLS_ATIMES_FAIL_UNREC
                                   : SUNLS_ATIMES_FAIL_REC;
        return (LASTFLAG(S));
      }

      /* Apply left preconditioning: vtemp = P1_inv A P2_inv s2_inv V[l] */
      if (preOnLeft)
      {
        status = psolve(P_data, V[l_plus_1], vtemp, delta, SUN_PREC_LEFT);
        if (status != 0)
        {
          *zeroguess  = SUNFALSE;
          LASTFLAG(S) = (status < 0) ? SUNLS_PSOLVE_FAIL_UNREC
                                     : SUNLS_PSOLVE_FAIL_REC;
          return (LASTFLAG(S));
        }
      }
      else
      {
        N_VScale(ONE, V[l_plus_1], vtemp);
        SUNCheckLastErr();
      }

      /* Apply left scaling: V[l+1] = s1 P1_inv A P2_inv s2_inv V[l] */
      if (scale1)
      {
        N_VProd(s1, vtemp, V[l_plus_1]);
        SUNCheckLastErr();
      }
      else
      {
        N_VScale(ONE, vtemp, V[l_plus_1]);
        SUNCheckLastErr();
      }

      /*  Orthogonalize V[l+1] against previous V[i]: V[l+1] = w_tilde */
      if (gstype == SUN_CLASSICAL_GS)
      {
        SUNCheckCall(
          SUNClassicalGS(V, Hes, l_plus_1, l_max, &(Hes[l_plus_1][l]), cv, Xv));
      }
      else
      {
        SUNCheckCall(SUNModifiedGS(V, Hes, l_plus_1, l_max, &(Hes[l_plus_1][l])));
      }

      /*  Update the QR factorization of Hes */
      if (SUNQRfact(krydim, Hes, givens, l) != 0)
      {
        *zeroguess  = SUNFALSE;
        LASTFLAG(S) = SUNLS_QRFACT_FAIL;
        return (LASTFLAG(S));
      }

      /*  Update residual norm estimate; break if convergence test passes */
      rotation_product *= givens[2 * l + 1];
      *res_norm = rho = SUNRabs(rotation_product * r_norm);

#if SUNDIALS_LOGGING_LEVEL >= SUNDIALS_LOGGING_INFO
      SUNLogger_QueueMsg(S->sunctx->logger, SUN_LOGLEVEL_INFO,
                         "SUNLinSolSolve_SPGMR", "iterate-residual",
                         "nli = %li, resnorm = %.16g", (long int)*nli, *res_norm);
#endif

      if (rho <= delta)
      {
        converged = SUNTRUE;
        break;
      }

      /* Normalize V[l+1] with norm value from the Gram-Schmidt routine */
      N_VScale(ONE / Hes[l_plus_1][l], V[l_plus_1], V[l_plus_1]);
      SUNCheckLastErr();
    }

    /* Inner loop is done.  Compute the new correction vector xcor */

    /*   Construct g, then solve for y */
    yg[0] = r_norm;
    for (i = 1; i <= krydim; i++) { yg[i] = ZERO; }
    if (SUNQRsol(krydim, Hes, givens, yg) != 0)
    {
      *zeroguess  = SUNFALSE;
      LASTFLAG(S) = SUNLS_QRSOL_FAIL;
      return (LASTFLAG(S));
    }

    /*   Add correction vector V_l y to xcor */
    cv[0] = ONE;
    Xv[0] = xcor;

    for (k = 0; k < krydim; k++)
    {
      cv[k + 1] = yg[k];
      Xv[k + 1] = V[k];
    }
    SUNCheckCall(N_VLinearCombination(krydim + 1, cv, Xv, xcor));

    /* If converged, construct the final solution vector x and return */
    if (converged)
    {
      /* Apply right scaling and right precond.: vtemp = P2_inv s2_inv xcor */
      if (scale2)
      {
        N_VDiv(xcor, s2, xcor);
        SUNCheckLastErr();
      }

      if (preOnRight)
      {
        status = psolve(P_data, xcor, vtemp, delta, SUN_PREC_RIGHT);
        if (status != 0)
        {
          *zeroguess  = SUNFALSE;
          LASTFLAG(S) = (status < 0) ? SUNLS_PSOLVE_FAIL_UNREC
                                     : SUNLS_PSOLVE_FAIL_REC;
          return (LASTFLAG(S));
        }
      }
      else
      {
        N_VScale(ONE, xcor, vtemp);
        SUNCheckLastErr();
      }

      /* Add vtemp to initial x to get final solution x, and return */
      if (*zeroguess)
      {
        N_VScale(ONE, vtemp, x);
        SUNCheckLastErr();
      }
      else
      {
        N_VLinearSum(ONE, x, ONE, vtemp, x);
        SUNCheckLastErr();
      }

      *zeroguess  = SUNFALSE;
      LASTFLAG(S) = SUN_SUCCESS;
      return (LASTFLAG(S));
    }

    /* Not yet converged; if allowed, prepare for restart */
    if (ntries == max_restarts) { break; }

    /* Construct last column of Q in yg */
    s_product = ONE;
    for (i = krydim; i > 0; i--)
    {
      yg[i] = s_product * givens[2 * i - 2];
      s_product *= givens[2 * i - 1];
    }
    yg[0] = s_product;

    /* Scale r_norm and yg */
    r_norm *= s_product;
    for (i = 0; i <= krydim; i++) { yg[i] *= r_norm; }
    r_norm = SUNRabs(r_norm);

    /* Multiply yg by V_(krydim+1) to get last residual vector; restart */
    for (k = 0; k <= krydim; k++)
    {
      cv[k] = yg[k];
      Xv[k] = V[k];
    }
    SUNCheckCall(N_VLinearCombination(krydim + 1, cv, Xv, V[0]));
  }

  /* Failed to converge, even after allowed restarts.
     If the residual norm was reduced below its initial value, compute
     and return x anyway.  Otherwise return failure flag. */
  if (rho < beta)
  {
    /* Apply right scaling and right precond.: vtemp = P2_inv s2_inv xcor */
    if (scale2)
    {
      N_VDiv(xcor, s2, xcor);
      SUNCheckLastErr();
    }

    if (preOnRight)
    {
      status = psolve(P_data, xcor, vtemp, delta, SUN_PREC_RIGHT);
      if (status != 0)
      {
        *zeroguess  = SUNFALSE;
        LASTFLAG(S) = (status < 0) ? SUNLS_PSOLVE_FAIL_UNREC
                                   : SUNLS_PSOLVE_FAIL_REC;
        return (LASTFLAG(S));
      }
    }
    else
    {
      N_VScale(ONE, xcor, vtemp);
      SUNCheckLastErr();
    }

    /* Add vtemp to initial x to get final solution x, and return */
    if (*zeroguess)
    {
      N_VScale(ONE, vtemp, x);
      SUNCheckLastErr();
    }
    else
    {
      N_VLinearSum(ONE, x, ONE, vtemp, x);
      SUNCheckLastErr();
    }

    *zeroguess  = SUNFALSE;
    LASTFLAG(S) = SUNLS_RES_REDUCED;
    return (LASTFLAG(S));
  }

  *zeroguess  = SUNFALSE;
  LASTFLAG(S) = SUNLS_CONV_FAIL;
  return (LASTFLAG(S));
}